

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O0

int main(int argc,char **argv)

{
  __sighandler_t p_Var1;
  long lVar2;
  char **in_RSI;
  int in_EDI;
  int pktlen;
  int pktnum;
  uint16_t devn;
  uint16_t busn;
  uintptr_t addr;
  psmem_thread pth [16];
  nettlp_cb cb;
  nettlp nt;
  psmem psmem;
  in_addr remote_host;
  int n;
  int ch;
  int ret;
  nettlp *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  uint uVar3;
  uint local_398;
  in_addr addr_00;
  uintptr_t uVar4;
  pthread_t local_388 [2];
  byte abStack_376 [2];
  undefined4 uStack_374;
  long alStack_370 [93];
  undefined1 local_88 [16];
  code *local_78;
  code *local_70;
  undefined8 local_50;
  ushort local_48;
  undefined6 uStack_46;
  long local_40;
  uintptr_t local_38 [2];
  void *local_28;
  undefined1 local_20 [4];
  int local_1c;
  int local_18;
  int local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(&local_50,0,0x18);
  uVar4 = 0;
  addr_00.s_addr = 0;
  local_398 = 0;
  uVar3 = 0;
  do {
    local_18 = getopt(local_8,local_10,"r:l:b:R:a:m:HSn:s:");
    if (local_18 == -1) {
      local_38[0] = uVar4;
      local_28 = malloc(0x10000000);
      local_38[1] = 0x10000000;
      memset(local_88,0,0x38);
      local_78 = psmem_mrd;
      local_70 = psmem_mwr;
      if ((0 < (int)local_398) && (0x3b < (int)uVar3)) {
        if (0x800 < (int)uVar3) {
          fprintf(_stderr,"%s:ERR: too large packet size. must be <= 2048\n","main");
          return -1;
        }
        if (nostdout == 0) {
          fprintf(_stdout,"%s: initalize the region with %d %d-byte packets\n","main",
                  (ulong)local_398,(ulong)uVar3);
        }
        initialize_with_packets
                  ((void *)CONCAT44(uVar3,in_stack_fffffffffffffc60),
                   (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),(int)in_stack_fffffffffffffc58);
      }
      printf("start psmem callbacks. BAR4 is %#lx, Dev is 0x%x\n",uVar4,(ulong)local_48);
      local_1c = 0;
      while( true ) {
        if (0xf < local_1c) {
          p_Var1 = signal(2,sig_handler);
          if (p_Var1 == (__sighandler_t)0xffffffffffffffff) {
            perror("cannot set signal\n");
            local_4 = -1;
          }
          else {
            for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
              pthread_join(local_388[(long)local_1c * 6],(void **)0x0);
            }
            local_4 = 0;
          }
          return local_4;
        }
        alStack_370[(long)local_1c * 6 + 1] = (long)local_38;
        alStack_370[(long)local_1c * 6 + 2] = (long)local_88;
        lVar2 = (long)local_1c;
        local_388[lVar2 * 6 + 1] = local_50;
        *(ulong *)(&stack0xfffffffffffffc88 + lVar2 * 0x30) = CONCAT62(uStack_46,local_48);
        alStack_370[lVar2 * 6] = local_40;
        abStack_376[(long)local_1c * 0x30] = (byte)local_1c;
        *(undefined4 *)((long)alStack_370 + (long)local_1c * 0x30 + -4) = 1;
        local_14 = nettlp_init(in_stack_fffffffffffffc58);
        if (local_14 < 0) break;
        local_14 = pthread_create(local_388 + (long)local_1c * 6,(pthread_attr_t *)0x0,
                                  nettlp_cb_thread,local_388 + (long)local_1c * 6);
        if (local_14 < 0) {
          fprintf(_stderr,"%s:ERR: failed to create thread for cpu %u","main",
                  (ulong)abStack_376[(long)local_1c * 0x30]);
          perror("pthread_create");
          return local_14;
        }
        usleep(0x14);
        local_1c = local_1c + 1;
      }
      fprintf(_stderr,"%s:ERR: nettlp_init for tag %u failed","main",
              (ulong)abStack_376[(long)local_1c * 0x30]);
      perror("nettlp_init");
      return local_14;
    }
    in_stack_fffffffffffffc58 = (nettlp *)(ulong)(local_18 - 0x48);
    switch(in_stack_fffffffffffffc58) {
    case (nettlp *)0x0:
      nohex = 1;
      break;
    default:
      usage();
      return -1;
    case (nettlp *)0xa:
      local_14 = inet_pton(2,_optarg,local_20);
      if (local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      uVar4 = nettlp_msg_get_bar4_start(addr_00);
      if (uVar4 == 0) {
        perror("nettlp_msg_get_bar4_start");
        return -1;
      }
      local_48 = nettlp_msg_get_dev_id((in_addr)(in_addr_t)uVar4);
      break;
    case (nettlp *)0xb:
      nostdout = 1;
      break;
    case (nettlp *)0x19:
      local_14 = __isoc99_sscanf(_optarg,"0x%lx",&stack0xfffffffffffffc70);
      break;
    case (nettlp *)0x1a:
      local_14 = __isoc99_sscanf(_optarg,"%hx:%hx",&stack0xfffffffffffffc6e,&stack0xfffffffffffffc6c
                                );
      local_48 = (short)(addr_00.s_addr >> 0x10) << 8 | (ushort)addr_00.s_addr;
      break;
    case (nettlp *)0x24:
      local_14 = inet_pton(2,_optarg,(void *)((long)&local_50 + 4));
      if (local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case (nettlp *)0x25:
      mrd_sleep = atoi(_optarg);
      break;
    case (nettlp *)0x26:
      local_398 = atoi(_optarg);
      break;
    case (nettlp *)0x2a:
      local_14 = inet_pton(2,_optarg,&local_50);
      if (local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case (nettlp *)0x2b:
      uVar3 = atoi(_optarg);
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{

#define NTHREADS	16	/* adapter v0.15.1 uses tag & 0xF for ports */

	int ret, ch, n;
	struct in_addr remote_host;
	struct psmem psmem;
	struct nettlp nt;	/* the original nettlp */
	struct nettlp_cb cb;
	struct psmem_thread pth[NTHREADS];
	uintptr_t addr;
	uint16_t busn, devn;
	int pktnum, pktlen;

	memset(&nt, 0, sizeof(nt));
	addr = 0;
	busn = 0;
	devn = 0;

	pktnum = 0;
	pktlen = 0;

	while ((ch = getopt(argc, argv, "r:l:b:R:a:m:HSn:s:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 'R':
			ret = inet_pton(AF_INET, optarg, &remote_host);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}

			addr = nettlp_msg_get_bar4_start(remote_host);
			if (addr == 0) {
				perror("nettlp_msg_get_bar4_start");
				return -1;
			}

			nt.requester = nettlp_msg_get_dev_id(remote_host);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 'm':
			mrd_sleep = atoi(optarg);
			break;

		case 'H':
			nohex = 1;
			break;

		case 'S':
			nostdout = 1;
			break;

		case 'n':
			pktnum = atoi(optarg);
			break;

		case 's':
			pktlen = atoi(optarg);
			break;

		default :
			usage();
			return -1;
		}
	}

	/* initalize psmem area and callback */
	psmem.addr = addr;
	psmem.mem = malloc(1024 * 1024 * 256);	/* 256MB */
	psmem.size = 1024 * 1024 * 256;

	memset(&cb, 0, sizeof(cb));
	cb.mrd = psmem_mrd;
	cb.mwr = psmem_mwr;

	if (pktnum > 0 && pktlen >= 60) {
		if (pktlen > 2048) {
			pr_err("too large packet size. must be <= 2048\n");
			return -1;
		}

		pr_info("initalize the region with %d %d-byte packets\n",
			pktnum, pktlen);
		initialize_with_packets(psmem.mem, pktlen, pktnum);
	}

	printf("start psmem callbacks. BAR4 is %#lx, Dev is 0x%x\n",
	       addr, nt.requester);

	/* initalize and start threads on each port 0x3000 + 0x0 ~ 0xF */
	for (n = 0; n < NTHREADS; n++) {
		pth[n].psmem = &psmem;
		pth[n].cb = &cb;
		pth[n].nt = nt;
		pth[n].nt.tag = n;
		pth[n].nt.dir = DMA_ISSUED_BY_ADAPTER;

		ret = nettlp_init(&pth[n].nt);
		if (ret < 0) {
			pr_err("nettlp_init for tag %u failed", pth[n].nt.tag);
			perror("nettlp_init");
			return ret;
		}

		ret = pthread_create(&pth[n].tid, NULL, nettlp_cb_thread,
				     &pth[n]);
		if (ret < 0) {
			pr_err("failed to create thread for cpu %u",
			       pth[n].nt.tag);
			perror("pthread_create");
			return ret;
		}

		usleep(20);	/*XXX: to serialiez start output on threads */
	}

	/* set signal handler to stop callback threads */
	if (signal(SIGINT, sig_handler) == SIG_ERR) {
		perror("cannot set signal\n");
		return -1;
	}

	/* thread join */
	for (n = 0; n < NTHREADS; n++)
		pthread_join(pth[n].tid, NULL);

	return 0;
}